

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O3

uint32_t utf8::prior<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        start)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  uint32_t uVar1;
  undefined8 *puVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  end = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         )it->_M_current;
  if (end._M_current != start._M_current) {
    local_10._M_current = end._M_current + -1;
    it->_M_current = (char *)local_10;
    uVar1 = next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(&local_10,end);
    return uVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001a4310;
  __cxa_throw(puVar2,&not_enough_room::typeinfo,std::exception::~exception);
}

Assistant:

uint32_t prior(octet_iterator& it, octet_iterator start)
    {
        // can't do much if it == start
        if (it == start)
            throw not_enough_room();

        octet_iterator end = it;
        // Go back until we hit either a lead octet or start
        while (utf8::internal::is_trail(*(--it)))
            if (it == start)
                throw invalid_utf8(*it); // error - no lead byte in the sequence
        return utf8::peek_next(it, end);
    }